

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2,undefined8 param_3)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  rt_expression_interface<double> *prVar1;
  op_interface_type *poVar2;
  rt_expression_interface<double> *prVar3;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_01;
  op_interface_type *op;
  rt_expression_interface<double> *diff_var_local;
  rt_expression_interface<double> *rhs_local;
  rt_expression_interface<double> *lhs_local;
  
  this = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*lhs + 0x90))(lhs,param_3);
  poVar2 = (op_interface_type *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_> *
             )poVar2);
  prVar3 = (rt_expression_interface<double> *)(**(code **)(*param_2 + 0x10))();
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this_00,prVar1,poVar2,prVar3);
  poVar2 = (op_interface_type *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_plus<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_plus<double>,_viennamath::rt_expression_interface<double>_> *
             )poVar2);
  this_01 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*lhs + 0x10))();
  op = (op_interface_type *)operator_new(8);
  op->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_> *
             )op);
  prVar3 = (rt_expression_interface<double> *)(**(code **)(*param_2 + 0x90))(param_2,param_3);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this_01,prVar1,op,prVar3);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this,(rt_expression_interface<double> *)this_00,poVar2,
             (rt_expression_interface<double> *)this_01);
  return &this->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * lhs, op_mult<NumericT>, const InterfaceType * rhs, const InterfaceType * diff_var)
  {
      return new rt_binary_expr<InterfaceType>( new rt_binary_expr<InterfaceType>(lhs->diff(diff_var),
                                                                                  new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                                                  rhs->clone()),
                                                new op_binary<op_plus<NumericT>, InterfaceType>(),
                                                new rt_binary_expr<InterfaceType>(lhs->clone(),
                                                                                  new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                                                  rhs->diff(diff_var) )
                            );
  }